

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_run_container_xor(run_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  run_container_t *dst_00;
  container_t *pcVar1;
  run_container_t *in_RDX;
  run_container_t *in_RSI;
  uint8_t typecode_after;
  run_container_t *ans;
  undefined7 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdf;
  
  dst_00 = run_container_create();
  run_container_xor(in_RSI,in_RDX,dst_00);
  pcVar1 = convert_run_to_efficient_container_and_free
                     (dst_00,(uint8_t *)
                             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  *(container_t **)in_RDX = pcVar1;
  return (int)in_stack_ffffffffffffffdf;
}

Assistant:

int run_run_container_xor(const run_container_t *src_1,
                          const run_container_t *src_2, container_t **dst) {
    run_container_t *ans = run_container_create();
    run_container_xor(src_1, src_2, ans);
    uint8_t typecode_after;
    *dst = convert_run_to_efficient_container_and_free(ans, &typecode_after);
    return typecode_after;
}